

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall
clipp::usage_lines::start_group(usage_lines *this,ostringstream *os,group *group,context *cur)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  group *pgVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  _Var7;
  child_t<clipp::parameter,_clipp::group> *pcVar8;
  long lVar9;
  doc_formatting *fmt;
  ulong uVar10;
  __string_type pfx;
  string lbl;
  stringstream buf;
  long *local_328;
  long local_320;
  long local_318 [2];
  string local_308;
  string local_2e8;
  int *local_2c8;
  int *local_2c0;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2b8;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2b0;
  string local_2a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288 [2];
  ios_base local_208 [264];
  context local_100;
  
  pgVar2 = (cur->pos).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].parent;
  joined_label_abi_cxx11_(&local_2a8,this,group,cur);
  if (local_2a8._M_string_length == 0) {
    if ((group->exclusive_ == true) && ((this->fmt_).splitTopAlt_ == true)) {
      pcVar8 = (group->children_).
               super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,__gnu_cxx::__ops::_Iter_pred<clipp::usage_lines::start_group(std::__cxx11::ostringstream&,clipp::group_const&,clipp::usage_lines::context&)const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>>
                        ((group->children_).
                         super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,pcVar8,this);
      if (_Var7._M_current != pcVar8) {
        paVar1 = &local_288[0].first.field_2;
        local_288[0].first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
        local_2b8 = &cur->postfixes;
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2b8,
                   &local_288[0].first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288[0].first._M_dataplus._M_p != paVar1) {
          operator_delete(local_288[0].first._M_dataplus._M_p,
                          local_288[0].first.field_2._M_allocated_capacity + 1);
        }
        local_288[0].first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
        local_2b0 = &cur->separators;
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2b0,
                   &local_288[0].first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288[0].first._M_dataplus._M_p != paVar1) {
          operator_delete(local_288[0].first._M_dataplus._M_p,
                          local_288[0].first.field_2._M_allocated_capacity + 1);
        }
        if (pgVar2 != group) {
          clipp::group::depth_first_traverser::operator++(&cur->pos);
        }
        cur->linestart = true;
        cur->useOutermost = false;
        std::__cxx11::stringbuf::str();
        local_288[0].first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
        std::__cxx11::stringbuf::str((string *)(os + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288[0].first._M_dataplus._M_p != paVar1) {
          operator_delete(local_288[0].first._M_dataplus._M_p,
                          local_288[0].first.field_2._M_allocated_capacity + 1);
        }
        if ((group->children_).
            super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (group->children_).
            super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_2c0 = &local_100.level;
          local_2c8 = &cur->level;
          uVar10 = 0;
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)local_288);
            pcVar8 = (cur->pos).stack_.
                     super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
            if (pcVar8->type_ != group) {
              pcVar8 = (child_t<clipp::parameter,_clipp::group> *)0x0;
            }
            cur->outermost = (group *)pcVar8;
            std::
            vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ::vector((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      *)&local_100,
                     (vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      *)cur);
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::deque(&local_100.separators.c,&local_2b0->c);
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::deque(&local_100.postfixes.c,&local_2b8->c);
            *(undefined8 *)(local_2c0 + 4) = *(undefined8 *)(local_2c8 + 4);
            iVar6 = local_2c8[1];
            iVar4 = local_2c8[2];
            iVar5 = local_2c8[3];
            *local_2c0 = *local_2c8;
            local_2c0[1] = iVar6;
            local_2c0[2] = iVar4;
            local_2c0[3] = iVar5;
            local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2e8,local_308._M_dataplus._M_p,
                       local_308._M_dataplus._M_p +
                       CONCAT44(local_308._M_string_length._4_4_,(int)local_308._M_string_length));
            write<std::__cxx11::stringstream>
                      (this,(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)local_288,&local_100,&local_2e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
              operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1
                             );
            }
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~deque(&local_100.postfixes.c);
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~deque(&local_100.separators.c);
            if (local_100.pos.stack_.
                super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100.pos.stack_.
                              super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_100.pos.stack_.
                                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100.pos.stack_.
                                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            lVar9 = std::ostream::tellp();
            if ((int)local_308._M_string_length < lVar9) {
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)os,(char *)local_328,local_320);
              if (local_328 != local_318) {
                operator_delete(local_328,local_318[0] + 1);
              }
              if (uVar10 < ((long)(group->children_).
                                  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(group->children_).
                                  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           0xf83e0f83e0f83e1 - 1U) {
                iVar6 = cur->line;
                if (0 < iVar6) {
                  local_328 = local_318;
                  std::__cxx11::string::_M_construct((ulong)&local_328,(char)(this->fmt_).lineSpc_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)os,(char *)local_328,local_320);
                  if (local_328 != local_318) {
                    operator_delete(local_328,local_318[0] + 1);
                  }
                  iVar6 = cur->line;
                }
                cur->line = iVar6 + 1;
                local_328 = (long *)CONCAT71(local_328._1_7_,10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)os,(char *)&local_328,1);
              }
            }
            clipp::group::depth_first_traverser::next_sibling(&cur->pos);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_288);
            std::ios_base::~ios_base(local_208);
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)(((long)(group->children_).
                                           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(group->children_).
                                           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0xf83e0f83e0f83e1));
        }
        pcVar3 = (cur->pos).stack_.
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((cur->pos).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish != pcVar3) {
          (cur->pos).stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_finish = pcVar3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00113fe9;
      }
    }
    fmt = (doc_formatting *)cur;
    group_surrounders_abi_cxx11_(local_288,this,group,cur);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,local_288[0].first._M_dataplus._M_p,local_288[0].first._M_string_length
              );
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cur->postfixes,
               &local_288[0].second);
    group_separator_abi_cxx11_(&local_308,(usage_lines *)group,(group *)&this->fmt_,fmt);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cur->separators,
               &local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if (pgVar2 != group) {
      clipp::group::depth_first_traverser::operator++(&cur->pos);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288[0].second._M_dataplus._M_p != &local_288[0].second.field_2) {
      operator_delete(local_288[0].second._M_dataplus._M_p,
                      local_288[0].second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288[0].first._M_dataplus._M_p != &local_288[0].first.field_2) {
      operator_delete(local_288[0].first._M_dataplus._M_p,
                      local_288[0].first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    cur->linestart = false;
    if (pgVar2 == group) {
      pcVar3 = (cur->pos).stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((cur->pos).stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start == pcVar3) goto LAB_00113fd2;
      pcVar3[-1].cur._M_current = pcVar3[-1].end._M_current + -1;
    }
    clipp::group::depth_first_traverser::next_sibling(&cur->pos);
  }
LAB_00113fd2:
  cur->level = (int)((ulong)((long)(cur->pos).stack_.
                                   super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(cur->pos).stack_.
                                  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
LAB_00113fe9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void start_group(std::ostringstream& os,
                     const group& group, context& cur) const
    {
        //does cur.pos already point to a member or to group itself?
        //needed for special treatment of outermost group
        const bool alreadyInside = &(cur.pos.parent()) == &group;

        auto lbl = joined_label(group, cur);
        if(!lbl.empty()) {
            os << lbl;
            cur.linestart = false;
            //skip over entire group as its label has already been created
            if(alreadyInside) {
                cur.pos.next_after_siblings();
            } else {
                cur.pos.next_sibling();
            }
        }
        else {
            const bool splitAlternatives = group.exclusive() &&
                fmt_.split_alternatives() &&
                std::any_of(group.begin(), group.end(),
                    [this](const pattern& p) {
                        return int(p.param_count()) >= fmt_.alternatives_min_split_size();
                    });

            if(splitAlternatives) {
                cur.postfixes.push("");
                cur.separators.push("");
                //recursively print alternative paths in decision-DAG
                //enter group?
                if(!alreadyInside) ++cur.pos;
                cur.linestart = true;
                cur.useOutermost = false;
                auto pfx = os.str();
                os.str("");
                //print paths in DAG starting at each group member
                for(std::size_t i = 0; i < group.size(); ++i) {
                    std::stringstream buf;
                    cur.outermost = cur.pos->is_group() ? &(cur.pos->as_group()) : nullptr;
                    write(buf, cur, pfx);
                    if(buf.tellp() > int(pfx.size())) {
                        os << buf.str();
                        if(i < group.size()-1) {
                            if(cur.line > 0) {
                                os << string(fmt_.line_spacing(), '\n');
                            }
                            ++cur.line;
                            os << '\n';
                        }
                    }
                    cur.pos.next_sibling(); //do not descend into members
                }
                cur.pos.invalidate(); //signal end-of-path
                return;
            }
            else {
                //pre & postfixes, separators
                auto surround = group_surrounders(group, cur);
                os << surround.first;
                cur.postfixes.push(std::move(surround.second));
                cur.separators.push(group_separator(group, fmt_));
                //descend into group?
                if(!alreadyInside) ++cur.pos;
            }
        }
        cur.level = cur.pos.level();
    }